

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_codec_err_t
decoder_decode(aom_codec_alg_priv_t *ctx,uint8_t *data,size_t data_sz,void *user_priv)

{
  int iVar1;
  aom_codec_err_t aVar2;
  size_t in_RDX;
  aom_codec_alg_priv_t *in_RSI;
  long in_RDI;
  uint8_t marker;
  size_t length_of_size_1;
  uint64_t frame_size;
  uint64_t temporal_unit_size;
  size_t length_of_size;
  uint8_t *data_end;
  uint8_t *data_start;
  aom_codec_err_t res;
  size_t local_60;
  aom_codec_alg_priv_t *in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  aom_codec_alg_priv_t *in_stack_ffffffffffffffc0;
  aom_codec_alg_priv_t *data_00;
  aom_codec_err_t local_2c;
  aom_codec_err_t local_4;
  
  local_2c = AOM_CODEC_OK;
  release_pending_output_frames(in_stack_ffffffffffffffc0);
  if ((in_RSI == (aom_codec_alg_priv_t *)0x0) && (in_RDX == 0)) {
    *(undefined4 *)(in_RDI + 0x1a4) = 1;
    local_4 = AOM_CODEC_OK;
  }
  else if ((in_RSI == (aom_codec_alg_priv_t *)0x0) || (in_RDX == 0)) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    *(undefined4 *)(in_RDI + 0x1a4) = 0;
    if ((*(long *)(in_RDI + 0x69f0) != 0) ||
       (local_2c = init_decoder(in_stack_ffffffffffffffa8), local_4 = local_2c,
       local_2c == AOM_CODEC_OK)) {
      data_00 = (aom_codec_alg_priv_t *)((long)&(in_RSI->base).err_detail + in_RDX);
      if (*(int *)(in_RDI + 0x69e0) != 0) {
        iVar1 = aom_uleb_decode((uint8_t *)in_RSI,in_RDX,(uint64_t *)&stack0xffffffffffffffb0,
                                (size_t *)&stack0xffffffffffffffb8);
        if (iVar1 != 0) {
          return AOM_CODEC_CORRUPT_FRAME;
        }
        in_RSI = (aom_codec_alg_priv_t *)
                 ((long)&(in_RSI->base).err_detail + in_stack_ffffffffffffffb8);
        if ((void *)((long)data_00 - (long)in_RSI) < in_stack_ffffffffffffffb0) {
          return AOM_CODEC_CORRUPT_FRAME;
        }
        data_00 = (aom_codec_alg_priv_t *)
                  ((long)&(in_RSI->base).err_detail + (long)in_stack_ffffffffffffffb0);
      }
      while (in_RSI < data_00) {
        if (*(int *)(in_RDI + 0x69e0) == 0) {
          in_stack_ffffffffffffffa8 = (aom_codec_alg_priv_t *)((long)data_00 - (long)in_RSI);
        }
        else {
          iVar1 = aom_uleb_decode((uint8_t *)in_RSI,(long)data_00 - (long)in_RSI,
                                  (uint64_t *)&stack0xffffffffffffffa8,&local_60);
          if (iVar1 != 0) {
            return AOM_CODEC_CORRUPT_FRAME;
          }
          in_RSI = (aom_codec_alg_priv_t *)((long)&(in_RSI->base).err_detail + local_60);
          if ((aom_codec_alg_priv_t *)((long)data_00 - (long)in_RSI) < in_stack_ffffffffffffffa8) {
            return AOM_CODEC_CORRUPT_FRAME;
          }
        }
        aVar2 = decode_one(in_RSI,(uint8_t **)data_00,in_stack_ffffffffffffffb8,
                           in_stack_ffffffffffffffb0);
        if (aVar2 != AOM_CODEC_OK) {
          return aVar2;
        }
        for (; (local_2c = AOM_CODEC_OK, in_RSI < data_00 &&
               (*(uint8_t *)&(in_RSI->base).err_detail == '\0'));
            in_RSI = (aom_codec_alg_priv_t *)((long)&(in_RSI->base).err_detail + 1)) {
        }
      }
      local_4 = local_2c;
    }
  }
  return local_4;
}

Assistant:

static aom_codec_err_t decoder_decode(aom_codec_alg_priv_t *ctx,
                                      const uint8_t *data, size_t data_sz,
                                      void *user_priv) {
  aom_codec_err_t res = AOM_CODEC_OK;

#if CONFIG_INSPECTION
  if (user_priv != 0) {
    return decoder_inspect(ctx, data, data_sz, user_priv);
  }
#endif

  release_pending_output_frames(ctx);

  /* Sanity checks */
  /* NULL data ptr allowed if data_sz is 0 too */
  if (data == NULL && data_sz == 0) {
    ctx->flushed = 1;
    return AOM_CODEC_OK;
  }
  if (data == NULL || data_sz == 0) return AOM_CODEC_INVALID_PARAM;

  // Reset flushed when receiving a valid frame.
  ctx->flushed = 0;

  // Initialize the decoder worker on the first frame.
  if (ctx->frame_worker == NULL) {
    res = init_decoder(ctx);
    if (res != AOM_CODEC_OK) return res;
  }

  const uint8_t *data_start = data;
  const uint8_t *data_end = data + data_sz;

  if (ctx->is_annexb) {
    // read the size of this temporal unit
    size_t length_of_size;
    uint64_t temporal_unit_size;
    if (aom_uleb_decode(data_start, data_sz, &temporal_unit_size,
                        &length_of_size) != 0) {
      return AOM_CODEC_CORRUPT_FRAME;
    }
    data_start += length_of_size;
    if (temporal_unit_size > (size_t)(data_end - data_start))
      return AOM_CODEC_CORRUPT_FRAME;
    data_end = data_start + temporal_unit_size;
  }

  // Decode in serial mode.
  while (data_start < data_end) {
    uint64_t frame_size;
    if (ctx->is_annexb) {
      // read the size of this frame unit
      size_t length_of_size;
      if (aom_uleb_decode(data_start, (size_t)(data_end - data_start),
                          &frame_size, &length_of_size) != 0) {
        return AOM_CODEC_CORRUPT_FRAME;
      }
      data_start += length_of_size;
      if (frame_size > (size_t)(data_end - data_start))
        return AOM_CODEC_CORRUPT_FRAME;
    } else {
      frame_size = (uint64_t)(data_end - data_start);
    }

    res = decode_one(ctx, &data_start, (size_t)frame_size, user_priv);
    if (res != AOM_CODEC_OK) return res;

    // Allow extra zero bytes after the frame end
    while (data_start < data_end) {
      const uint8_t marker = data_start[0];
      if (marker) break;
      ++data_start;
    }
  }

  return res;
}